

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string * __thiscall slang::parsing::Token::toString_abi_cxx11_(Token *this)

{
  SyntaxPrinter *in_RDI;
  SyntaxPrinter *in_stack_00000110;
  undefined1 in_stack_00000118 [16];
  SyntaxPrinter *in_stack_ffffffffffffff68;
  
  slang::syntax::SyntaxPrinter::SyntaxPrinter(in_RDI);
  slang::syntax::SyntaxPrinter::print(in_stack_00000110,(Token)in_stack_00000118);
  slang::syntax::SyntaxPrinter::str_abi_cxx11_(in_stack_ffffffffffffff68);
  slang::syntax::SyntaxPrinter::~SyntaxPrinter((SyntaxPrinter *)0xc728c5);
  return &in_RDI->buffer;
}

Assistant:

std::string Token::toString() const {
    return SyntaxPrinter().print(*this).str();
}